

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.c
# Opt level: O1

void chck_pool_flush(chck_pool *pool)

{
  if (pool != (chck_pool *)0x0) {
    free((pool->items).buffer);
    (pool->items).buffer = (uint8_t *)0x0;
    (pool->items).used = 0;
    (pool->items).allocated = 0;
    (pool->items).count = 0;
    free((pool->map).buffer);
    (pool->map).buffer = (uint8_t *)0x0;
    (pool->map).used = 0;
    (pool->map).allocated = 0;
    (pool->map).count = 0;
    free((pool->removed).buffer);
    (pool->removed).buffer = (uint8_t *)0x0;
    (pool->removed).used = 0;
    (pool->removed).allocated = 0;
    (pool->removed).count = 0;
    return;
  }
  __assert_fail("pool",
                "/workspace/llm4binary/github/license_c_cmakelists/Cloudef[P]chck/chck/pool/pool.c",
                0x13b,"void chck_pool_flush(struct chck_pool *)");
}

Assistant:

void
chck_pool_flush(struct chck_pool *pool)
{
   assert(pool);
   pool_buffer_flush(&pool->items, true);
   pool_buffer_flush(&pool->map, true);
   pool_buffer_flush(&pool->removed, true);
}